

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_lookup_cache.hpp
# Opt level: O2

int64_t __thiscall
duckdb::DateLookupCache<duckdb::DatePart::DayOperator>::ExtractElement
          (DateLookupCache<duckdb::DatePart::DayOperator> *this,date_t date,ValidityMask *mask,
          idx_t idx)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  
  if ((uint)date.days < 0x7390) {
    uVar2 = (ulong)*(ushort *)
                    ((long)(this->cache).
                           super_unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>
                           ._M_t.
                           super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>
                           .super__Head_base<0UL,_unsigned_short_*,_false> +
                    (ulong)(uint)date.days * 2);
  }
  else {
    bVar1 = Value::IsFinite<duckdb::date_t>(date);
    if (bVar1) {
      lVar3 = DatePart::DayOperator::Operation<duckdb::date_t,long>(date);
      return lVar3;
    }
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (&mask->super_TemplatedValidityMask<unsigned_long>,idx);
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

int64_t ExtractElement(date_t date, ValidityMask &mask, idx_t idx) const {
		if (DUCKDB_UNLIKELY(date.days < CACHE_MIN_DATE || date.days >= CACHE_MAX_DATE)) {
			if (DUCKDB_UNLIKELY(!Value::IsFinite(date))) {
				mask.SetInvalid(idx);
				return 0;
			}
			return OP::template Operation<date_t, int64_t>(date);
		}
		return cache[GetDateCacheEntry(date)];
	}